

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::calculateProb0(NewEdgeCalculator *this,mapValue *val1,double *res)

{
  const_reference pvVar1;
  double *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar2;
  value_type d;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)*in_RSI);
  dVar2 = *pvVar1;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    *in_RDX = dVar2 + *in_RDX;
  }
  else {
    dVar2 = log10(0.25);
    *in_RDX = dVar2 + *in_RDX;
  }
  return;
}

Assistant:

void NewEdgeCalculator::calculateProb0(const AlignmentRecord::mapValue & val1, double& res) const{
    //find positions which are non common positions and look up probability in empirical allele frequency distribution
    //const auto& k = this->SIMPSON_MAP.find(val1.ref);
    auto d = this->SIMPSON_MAP[val1.ref];
    if (d!=0){
        res+=d;
    //if (k != this->SIMPSON_MAP.end()){
    //    res *= k->second;
    } else {
        res +=std::log10(0.25);
    }

}